

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuCopyPragma(sqlite3rbu *p,char *zPragma)

{
  sqlite3 *psVar1;
  sqlite3_stmt *psVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  sqlite3_stmt *local_20;
  sqlite3_stmt *pPragma;
  char *zPragma_local;
  sqlite3rbu *p_local;
  
  if (p->rc == 0) {
    local_20 = (sqlite3_stmt *)0x0;
    psVar1 = p->dbRbu;
    pPragma = (sqlite3_stmt *)zPragma;
    zPragma_local = (char *)p;
    pcVar5 = sqlite3_mprintf("PRAGMA main.%s",zPragma);
    iVar3 = prepareFreeAndCollectError(psVar1,&local_20,&p->zErrmsg,pcVar5);
    *(int *)(zPragma_local + 0x38) = iVar3;
    if (*(int *)(zPragma_local + 0x38) == 0) {
      iVar3 = sqlite3_step(local_20);
      pcVar5 = zPragma_local;
      psVar2 = pPragma;
      if (iVar3 == 100) {
        psVar1 = *(sqlite3 **)(zPragma_local + 8);
        uVar4 = sqlite3_column_int(local_20,0);
        iVar3 = rbuMPrintfExec((sqlite3rbu *)pcVar5,psVar1,"PRAGMA main.%s = %d",psVar2,(ulong)uVar4
                              );
        *(int *)(zPragma_local + 0x38) = iVar3;
      }
    }
    rbuFinalize((sqlite3rbu *)zPragma_local,local_20);
  }
  return;
}

Assistant:

static void rbuCopyPragma(sqlite3rbu *p, const char *zPragma){
  if( p->rc==SQLITE_OK ){
    sqlite3_stmt *pPragma = 0;
    p->rc = prepareFreeAndCollectError(p->dbRbu, &pPragma, &p->zErrmsg, 
        sqlite3_mprintf("PRAGMA main.%s", zPragma)
    );
    if( p->rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pPragma) ){
      p->rc = rbuMPrintfExec(p, p->dbMain, "PRAGMA main.%s = %d",
          zPragma, sqlite3_column_int(pPragma, 0)
      );
    }
    rbuFinalize(p, pPragma);
  }
}